

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatChains.cpp
# Opt level: O0

void __thiscall FatChains::chainsAnalysis(FatChains *this)

{
  ostream *poVar1;
  size_type sVar2;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  list<FatChain,_std::allocator<FatChain>_> local_c8;
  undefined1 local_b0 [8];
  list<FatChain,_std::allocator<FatChain>_> orphanedChains;
  value_type_conflict2 local_84;
  undefined1 local_80 [8];
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  undefined1 local_40 [8];
  map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> chains;
  FatChains *this_local;
  
  chains._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  FatSystem::enableCache((this->super_FatModule).system);
  poVar1 = std::operator<<((ostream *)&std::cout,"Building the chains...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  findChains((map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> *
             )local_40,this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Found ");
  sVar2 = std::map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
          ::size((map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
                  *)local_40);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1," chains");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Running the recursive differential analysis...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80);
  this->saveEntries = false;
  this->exploreDamaged = false;
  recursiveExploration
            (this,(map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
                   *)local_40,(set<int,_std::less<int>,_std::allocator<int>_> *)local_80,
             (int)((this->super_FatModule).system)->rootDirectory,
             (vector<FatEntry,_std::allocator<FatEntry>_> *)0x0);
  local_84 = 0;
  pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80,&local_84);
  orphanedChains.super__List_base<FatChain,_std::allocator<FatChain>_>._M_impl._M_node._M_size =
       (size_t)pVar3.first._M_node;
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Having a look at the chains...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this->saveEntries = true;
  exploreChains(this,(map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
                      *)local_40,(set<int,_std::less<int>,_std::allocator<int>_> *)local_80);
  getOrphaned_abi_cxx11_
            ((list<FatChain,_std::allocator<FatChain>_> *)local_b0,this,
             (map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> *
             )local_40);
  std::__cxx11::list<FatChain,_std::allocator<FatChain>_>::list
            (&local_c8,(list<FatChain,_std::allocator<FatChain>_> *)local_b0);
  displayOrphaned(this,&local_c8);
  std::__cxx11::list<FatChain,_std::allocator<FatChain>_>::~list(&local_c8);
  std::__cxx11::list<FatChain,_std::allocator<FatChain>_>::~list
            ((list<FatChain,_std::allocator<FatChain>_> *)local_b0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_80);
  std::map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>::~map
            ((map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> *
             )local_40);
  return;
}

Assistant:

void FatChains::chainsAnalysis()
{
    system.enableCache();

    cout << "Building the chains..." << endl;
    map<int, FatChain> chains = findChains();

    /*
    map<int, FatChain>::iterator mit;
    for (mit=chains.begin(); mit!=chains.end(); mit++) {
        cout << mit->first << "~>" << mit->second.endCluster << endl;
    } 
    */

    cout << "Found " << chains.size() << " chains" << endl;
    cout << endl;

    cout << "Running the recursive differential analysis..." << endl;
    set<int> visited;
    saveEntries = false;
    exploreDamaged = false;
    recursiveExploration(chains, visited, system.rootDirectory);
    visited.insert(0);
    cout << endl;

    cout << "Having a look at the chains..." << endl;
    saveEntries = true;
    exploreChains(chains, visited);
   
    // Getting orphaned elements from the map
    list<FatChain> orphanedChains = getOrphaned(chains);
    displayOrphaned(orphanedChains);
}